

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

uint16_t crc16(uint16_t crc,uint8_t *buf,size_t len)

{
  ushort uVar1;
  ushort local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  size_t local_20;
  size_t len_local;
  uint8_t *buf_local;
  uint16_t crc_local;
  
  local_20 = len;
  len_local = (size_t)buf;
  buf_local._6_2_ = crc;
  while (local_20 != 0) {
    uVar1 = buf_local._6_2_ ^ *(byte *)len_local;
    if ((uVar1 & 1) == 0) {
      local_24 = (int)(uint)uVar1 >> 1;
    }
    else {
      local_24 = (int)(uint)uVar1 >> 1 ^ 0xa001;
    }
    local_28 = (int)local_24 >> 1;
    if ((local_24 & 1) != 0) {
      local_28 = local_28 ^ 0xa001;
    }
    local_2c = (int)local_28 >> 1;
    if ((local_28 & 1) != 0) {
      local_2c = local_2c ^ 0xa001;
    }
    local_30 = (int)local_2c >> 1;
    if ((local_2c & 1) != 0) {
      local_30 = local_30 ^ 0xa001;
    }
    local_34 = (int)local_30 >> 1;
    if ((local_30 & 1) != 0) {
      local_34 = local_34 ^ 0xa001;
    }
    local_38 = (int)local_34 >> 1;
    if ((local_34 & 1) != 0) {
      local_38 = local_38 ^ 0xa001;
    }
    local_3c = (int)local_38 >> 1;
    if ((local_38 & 1) != 0) {
      local_3c = local_3c ^ 0xa001;
    }
    local_40 = (ushort)((int)local_3c >> 1);
    if ((local_3c & 1) != 0) {
      local_40 = local_40 ^ 0xa001;
    }
    buf_local._6_2_ = local_40;
    local_20 = local_20 - 1;
    len_local = len_local + 1;
  }
  return buf_local._6_2_;
}

Assistant:

uint16_t crc16(uint16_t crc, uint8_t *buf, size_t len) {
    while (len--) {
        crc ^= *buf++;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    }
    return crc;
}